

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
(anonymous_namespace)::KeyConverter::ToString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,void *this,Key *key)

{
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_9a1342::KeyConverter::ToPKBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,(KeyConverter *)this
             ,key);
  s.m_size = (long)local_50._M_impl.super__Vector_impl_data._M_finish -
             (long)local_50._M_impl.super__Vector_impl_data._M_start;
  s.m_data = local_50._M_impl.super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_38,s);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> ToString(const Key& key) const {
        return HexStr(ToPKBytes(key));
    }